

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.c
# Opt level: O3

void beg(monst *mtmp)

{
  permonst *ppVar1;
  boolean bVar2;
  uint uVar3;
  int iVar4;
  obj *poVar5;
  
  uVar3 = *(uint *)&mtmp->field_0x60;
  if (((uVar3 & 0xc0000) != 0x40000) || (ppVar1 = mtmp->data, (ppVar1->mflags1 & 0x60000000) == 0))
  {
    return;
  }
  if ((byte)(ppVar1->msound - 1) < 0xd) {
    domonnoise(mtmp);
    return;
  }
  if (ppVar1->msound < 0x14) {
    return;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00246c3d;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00246be3;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00246bda;
    }
    else {
LAB_00246bda:
      if (ublindf == (obj *)0x0) goto LAB_00246c8c;
LAB_00246be3:
      if (ublindf->oartifact != '\x1d') goto LAB_00246c8c;
    }
    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))
       && ((ppVar1->mflags3 & 0x200) != 0)) goto LAB_00246c3d;
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 != '\0') {
      uVar3 = *(uint *)&mtmp->field_0x60;
LAB_00246c3d:
      if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar3 & 0x280) == 0) goto LAB_00246c7f;
      }
      else if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00246c7f:
        if ((u._1052_1_ & 0x20) == 0) goto LAB_00246deb;
      }
    }
  }
LAB_00246c8c:
  if (((mtmp->data->mflags1 & 0x10000) == 0) &&
     ((poVar5 = which_armor(mtmp,4), poVar5 == (obj *)0x0 ||
      (poVar5 = which_armor(mtmp,4), poVar5->otyp != 0x4f)))) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00246ce4;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00246cdf;
    }
    else {
LAB_00246cdf:
      if (ublindf != (obj *)0x0) {
LAB_00246ce4:
        if (ublindf->oartifact == '\x1d') goto LAB_00246d77;
      }
      if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
           (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
           youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_00246deb;
    }
LAB_00246d77:
    if ((u.uprops[0x19].extrinsic != 0) &&
       ((u.uprops[0x19].blocked == 0 &&
        (iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar4 < 0x41))))
    goto LAB_00246deb;
  }
  if ((u.uprops[0x42].intrinsic == 0) &&
     ((u.uprops[0x42].extrinsic == 0 && (bVar2 = match_warn_of_mon(mtmp), bVar2 == '\0')))) {
    map_invisible(mtmp->mx,mtmp->my);
  }
LAB_00246deb:
  verbalize("I\'m hungry.");
  return;
}

Assistant:

void beg(struct monst *mtmp)
{
    if (mtmp->msleeping || !mtmp->mcanmove ||
	    !(carnivorous(mtmp->data) || herbivorous(mtmp->data)))
	return;

    /* presumably nearness and soundok checks have already been made */
    if (!is_silent(mtmp->data) && mtmp->data->msound <= MS_ANIMAL)
	domonnoise(mtmp);
    else if (mtmp->data->msound >= MS_HUMANOID) {
	if (!canspotmon(level, mtmp))
	    map_invisible(mtmp->mx, mtmp->my);
	verbalize("I'm hungry.");
    }
}